

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O3

idx_t duckdb::BitStringAggOperation::GetRange<signed_char>(char min,char max)

{
  bool bVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  InvalidInputException *this;
  char result;
  string local_48;
  
  if (min <= max) {
    bVar1 = duckdb::TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                      ((int)max,(int)min,&local_48);
    iVar3 = 0xffffffffffffffff;
    if (bVar1) {
      uVar2 = NumericCastImpl<unsigned_long,_signed_char,_false>::Convert
                        ((char)local_48._M_dataplus._M_p);
      iVar3 = 0xffffffffffffffff;
      if (uVar2 + 1 != 0) {
        iVar3 = uVar2 + 1;
      }
    }
    return iVar3;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)","")
  ;
  InvalidInputException::InvalidInputException<signed_char,signed_char>(this,&local_48,min,max);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}